

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O1

void mxx::my_mpi_errorhandler(MPI_Comm *param_1,int *error_code,...)

{
  size_t sVar1;
  int error_class;
  int strlen;
  string classstr;
  string errorstr;
  char buf [256];
  allocator<char> local_171;
  undefined4 local_170;
  undefined1 local_16c [4];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  string local_148 [32];
  char local_128 [264];
  
  MPI_Error_class(*error_code,&local_170);
  MPI_Error_string(local_170,local_128,local_16c);
  local_168[0] = local_158;
  sVar1 = ::strlen(local_128);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,local_128,local_128 + sVar1);
  MPI_Error_string(*error_code,local_128,local_16c);
  std::__cxx11::string::string<std::allocator<char>>(local_148,local_128,&local_171);
  std::terminate();
}

Assistant:

inline void my_mpi_errorhandler(MPI_Comm* /*comm*/, int* error_code, ...) {
    char buf[MPI_MAX_ERROR_STRING];
    int strlen;
    int error_class;

    MPI_Error_class(*error_code, &error_class);
    MPI_Error_string(error_class, buf, &strlen);
    std::string classstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    MPI_Error_string(*error_code, buf, &strlen);
    std::string errorstr(buf);
    //fprintf(stderr, "%3d: %s\n", my_rank, error_string);
    // throw exception, enables gdb stack trace analysis
    std::terminate();
    throw std::runtime_error("[MPI Error] class: " + classstr + "\n[MPI Error] " + errorstr);
}